

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O2

mFILE * open_path_mfile(char *file,char *path,char *relative_to)

{
  int iVar1;
  char *__ptr;
  size_t sVar2;
  char *pcVar3;
  mFILE *pmVar4;
  char *__s1;
  char relative_path [4097];
  
  if (path == (char *)0x0) {
    path = getenv("RAWDATA");
  }
  __ptr = tokenise_search_path(path);
  pcVar3 = __ptr;
  if (__ptr == (char *)0x0) {
    return (mFILE *)0x0;
  }
  do {
    if (*pcVar3 == '|') {
      __s1 = pcVar3 + 1;
    }
    else {
      __s1 = pcVar3;
      if (*pcVar3 == '\0') {
        free(__ptr);
        if (relative_to == (char *)0x0) {
          return (mFILE *)0x0;
        }
        strcpy(relative_path,relative_to);
        pcVar3 = strrchr(relative_path,0x2f);
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '\0';
        }
        pmVar4 = find_file_dir(file,relative_path);
        if (pmVar4 == (mFILE *)0x0) {
          return (mFILE *)0x0;
        }
        return pmVar4;
      }
    }
    iVar1 = strncmp(__s1,"URL=",4);
    if (iVar1 == 0) {
      __s1 = __s1 + 4;
LAB_001238a8:
      pmVar4 = find_file_url(file,__s1);
    }
    else {
      iVar1 = strncmp(__s1,"http:",5);
      if ((iVar1 == 0) || (iVar1 = strncmp(__s1,"ftp:",4), iVar1 == 0)) goto LAB_001238a8;
      pmVar4 = find_file_dir(file,__s1);
    }
    if (pmVar4 != (mFILE *)0x0) {
      free(__ptr);
      return pmVar4;
    }
    sVar2 = strlen(pcVar3);
    pcVar3 = pcVar3 + sVar2 + 1;
  } while( true );
}

Assistant:

mFILE *open_path_mfile(char *file, char *path, char *relative_to) {
    char *newsearch;
    char *ele;
    mFILE *fp;

    /* Use path first */
    if (!path)
	path = getenv("RAWDATA");
    if (NULL == (newsearch = tokenise_search_path(path)))
	return NULL;
    
    /*
     * Step through the search path testing out each component.
     * We now look through each path element treating some prefixes as
     * special, otherwise we treat the element as a directory.
     */
    for (ele = newsearch; *ele; ele += strlen(ele)+1) {
	char *ele2;

	/*
	 * '|' prefixing a path component indicates that we do not
	 * wish to perform the compression extension searching in that
	 * location.
	 *
	 * NB: this has been removed from the htslib implementation.
	 */
	if (*ele == '|') {
	    ele2 = ele+1;
	} else {
	    ele2 = ele;
	}

	if (0 == strncmp(ele2, "URL=", 4)) {
	    if ((fp = find_file_url(file, ele2+4))) {
		free(newsearch);
		return fp;
	    }
	} else if (!strncmp(ele2, "http:", 5) ||
		   !strncmp(ele2, "ftp:", 4)) {
	    if ((fp = find_file_url(file, ele2))) {
		free(newsearch);
		return fp;
	    }
	} else if ((fp = find_file_dir(file, ele2))) {
	    free(newsearch);
	    return fp;
	} 
   }

    free(newsearch);

    /* Look in the same location as the incoming 'relative_to' filename */
    if (relative_to) {
	char *cp;
	char relative_path[PATH_MAX+1];
	strcpy(relative_path, relative_to);
	if ((cp = strrchr(relative_path, '/')))
	    *cp = 0;
	if ((fp = find_file_dir(file, relative_path)))
	    return fp;
    }

    return NULL;
}